

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave-common-sdl2.cpp
# Opt level: O0

bool GGWave_init(int playbackId,int captureId,int payloadLength,float sampleRateOffset,bool useDSS)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  byte in_CL;
  uint in_ESI;
  uint in_EDI;
  float in_XMM0_Da;
  OperatingMode mode;
  SampleFormat sampleFormatOut;
  SampleFormat sampleFormatInp;
  SDL_AudioSpec captureSpec;
  SDL_AudioSpec playbackSpec;
  bool reinit;
  int i_1;
  int nDevices_1;
  int i;
  int nDevices;
  shared_ptr<GGWave> *in_stack_ffffffffffffff30;
  undefined8 local_70;
  undefined2 local_68;
  undefined6 uStack_66;
  undefined8 local_60;
  undefined8 local_58;
  uint local_50;
  ushort local_4c;
  byte local_4a;
  ushort local_48;
  undefined8 local_40;
  byte local_29;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  byte local_15;
  float local_14;
  uint local_c;
  uint local_8;
  bool local_1;
  
  local_15 = in_CL & 1;
  if (((anonymous_namespace)::g_devIdInp == 0) || ((anonymous_namespace)::g_devIdOut == 0)) {
    local_14 = in_XMM0_Da;
    local_c = in_ESI;
    local_8 = in_EDI;
    if (((anonymous_namespace)::g_devIdInp == 0) && ((anonymous_namespace)::g_devIdOut == 0)) {
      SDL_LogSetPriority(0,3);
      iVar1 = SDL_Init(0x10);
      if (iVar1 < 0) {
        uVar4 = SDL_GetError();
        SDL_LogError(0,"Couldn\'t initialize SDL: %s\n",uVar4);
        return true;
      }
      SDL_SetHintWithPriority("SDL_AUDIO_RESAMPLING_MODE","medium",2);
      local_1c = SDL_GetNumAudioDevices(0);
      printf("Found %d playback devices:\n",(ulong)local_1c);
      for (local_20 = 0; uVar2 = local_20, (int)local_20 < (int)local_1c; local_20 = local_20 + 1) {
        uVar4 = SDL_GetAudioDeviceName(local_20,0);
        printf("    - Playback device #%d: \'%s\'\n",(ulong)uVar2,uVar4);
      }
      local_24 = SDL_GetNumAudioDevices(1);
      printf("Found %d capture devices:\n",(ulong)local_24);
      for (local_28 = 0; uVar2 = local_28, (int)local_28 < (int)local_24; local_28 = local_28 + 1) {
        uVar4 = SDL_GetAudioDeviceName(local_28,1);
        printf("    - Capture device #%d: \'%s\'\n",(ulong)uVar2,uVar4);
      }
    }
    local_29 = 0;
    if ((anonymous_namespace)::g_devIdOut == 0) {
      printf("Initializing playback ...\n");
      SDL_memset(&local_50,0,0x20);
      local_50 = (uint)(local_14 + 48000.0);
      local_4c = 0x8010;
      local_4a = 1;
      local_48 = 0x4000;
      local_40 = 0;
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecOut,0,0x20);
      uVar2 = local_8;
      if ((int)local_8 < 0) {
        printf("Attempt to open default playback device ...\n");
        (anonymous_namespace)::g_devIdOut =
             SDL_OpenAudioDevice(0,0,&local_50,&(anonymous_namespace)::g_obtainedSpecOut);
      }
      else {
        uVar4 = SDL_GetAudioDeviceName(local_8,0);
        printf("Attempt to open playback device %d : \'%s\' ...\n",(ulong)uVar2,uVar4);
        uVar4 = SDL_GetAudioDeviceName(local_8,0);
        (anonymous_namespace)::g_devIdOut =
             SDL_OpenAudioDevice(uVar4,0,&local_50,&(anonymous_namespace)::g_obtainedSpecOut);
      }
      if ((anonymous_namespace)::g_devIdOut == 0) {
        uVar4 = SDL_GetError();
        printf("Couldn\'t open an audio device for playback: %s!\n",uVar4);
        (anonymous_namespace)::g_devIdOut = 0;
      }
      else {
        printf("Obtained spec for output device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdOut);
        printf("    - Sample rate:       %d (required: %d)\n",
               (ulong)(uint)(anonymous_namespace)::g_obtainedSpecOut,(ulong)local_50);
        printf("    - Format:            %d (required: %d)\n",
               (ulong)(anonymous_namespace)::g_obtainedSpecOut._4_2_,(ulong)local_4c);
        printf("    - Channels:          %d (required: %d)\n",
               (ulong)(anonymous_namespace)::g_obtainedSpecOut._6_1_,(ulong)local_4a);
        printf("    - Samples per frame: %d (required: %d)\n",(ulong)(ushort)DAT_0010e688,
               (ulong)local_48);
        if ((((anonymous_namespace)::g_obtainedSpecOut._4_2_ != local_4c) ||
            ((anonymous_namespace)::g_obtainedSpecOut._6_1_ != local_4a)) ||
           ((ushort)DAT_0010e688 != local_48)) {
          (anonymous_namespace)::g_devIdOut = 0;
          SDL_CloseAudio();
          fprintf(_stderr,"Failed to initialize playback SDL_OpenAudio!");
          return false;
        }
        local_29 = 1;
      }
    }
    if ((anonymous_namespace)::g_devIdInp == 0) {
      local_60 = DAT_0010e690;
      local_58 = DAT_0010e698;
      local_70 = CONCAT26(CONCAT11((anonymous_namespace)::g_obtainedSpecOut._7_1_,
                                   (anonymous_namespace)::g_obtainedSpecOut._6_1_),
                          CONCAT24(0x8120,(int)(local_14 + 48000.0)));
      _local_68 = CONCAT62(DAT_0010e688._2_6_,0x400);
      SDL_memset(&(anonymous_namespace)::g_obtainedSpecInp,0,0x20);
      uVar2 = local_c;
      if ((int)local_c < 0) {
        printf("Attempt to open default capture device ...\n");
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          in_stack_ffffffffffffff30 = (shared_ptr<GGWave> *)std::__cxx11::string::c_str();
        }
        else {
          in_stack_ffffffffffffff30 = (shared_ptr<GGWave> *)0x0;
        }
        (anonymous_namespace)::g_devIdInp =
             SDL_OpenAudioDevice(in_stack_ffffffffffffff30,1,&local_70,
                                 &(anonymous_namespace)::g_obtainedSpecInp,0);
      }
      else {
        uVar4 = SDL_GetAudioDeviceName(local_c,1);
        printf("Attempt to open capture device %d : \'%s\' ...\n",(ulong)uVar2,uVar4);
        uVar4 = SDL_GetAudioDeviceName(local_c,1);
        (anonymous_namespace)::g_devIdInp =
             SDL_OpenAudioDevice(uVar4,1,&local_70,&(anonymous_namespace)::g_obtainedSpecInp,0);
      }
      if ((anonymous_namespace)::g_devIdInp == 0) {
        uVar4 = SDL_GetError();
        printf("Couldn\'t open an audio device for capture: %s!\n",uVar4);
        (anonymous_namespace)::g_devIdInp = 0;
      }
      else {
        printf("Obtained spec for input device (SDL Id = %d):\n",
               (ulong)(anonymous_namespace)::g_devIdInp);
        printf("    - Sample rate:       %d\n",(ulong)(anonymous_namespace)::g_obtainedSpecInp);
        printf("    - Format:            %d (required: %d)\n",(ulong)DAT_0010e6a4,
               local_70 >> 0x20 & 0xffff);
        printf("    - Channels:          %d (required: %d)\n",(ulong)DAT_0010e6a6,
               local_70 >> 0x30 & 0xff);
        printf("    - Samples per frame: %d\n",(ulong)DAT_0010e6a8);
        local_29 = 1;
      }
    }
    uVar2 = (uint)DAT_0010e6a4;
    uVar3 = (uint)(anonymous_namespace)::g_obtainedSpecOut._4_2_;
    if ((local_29 & 1) != 0) {
      std::make_shared<GGWave,ggwave_Parameters>((ggwave_Parameters *)0x400473b8000);
      std::shared_ptr<GGWave>::operator=
                (in_stack_ffffffffffffff30,(shared_ptr<GGWave> *)CONCAT44(uVar2,uVar3));
      std::shared_ptr<GGWave>::~shared_ptr((shared_ptr<GGWave> *)0x108753);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GGWave_init(
        const int playbackId,
        const int captureId,
        const int payloadLength,
        const float sampleRateOffset,
        const bool useDSS) {

    if (g_devIdInp && g_devIdOut) {
        return false;
    }

    if (g_devIdInp == 0 && g_devIdOut == 0) {
        SDL_LogSetPriority(SDL_LOG_CATEGORY_APPLICATION, SDL_LOG_PRIORITY_INFO);

        if (SDL_Init(SDL_INIT_AUDIO) < 0) {
            SDL_LogError(SDL_LOG_CATEGORY_APPLICATION, "Couldn't initialize SDL: %s\n", SDL_GetError());
            return (1);
        }

        SDL_SetHintWithPriority(SDL_HINT_AUDIO_RESAMPLING_MODE, "medium", SDL_HINT_OVERRIDE);

        {
            int nDevices = SDL_GetNumAudioDevices(SDL_FALSE);
            printf("Found %d playback devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Playback device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_FALSE));
            }
        }
        {
            int nDevices = SDL_GetNumAudioDevices(SDL_TRUE);
            printf("Found %d capture devices:\n", nDevices);
            for (int i = 0; i < nDevices; i++) {
                printf("    - Capture device #%d: '%s'\n", i, SDL_GetAudioDeviceName(i, SDL_TRUE));
            }
        }
    }

    bool reinit = false;

    if (g_devIdOut == 0) {
        printf("Initializing playback ...\n");

        SDL_AudioSpec playbackSpec;
        SDL_zero(playbackSpec);

        playbackSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        playbackSpec.format = AUDIO_S16SYS;
        playbackSpec.channels = 1;
        playbackSpec.samples = 16*1024;
        playbackSpec.callback = NULL;

        SDL_zero(g_obtainedSpecOut);

        if (playbackId >= 0) {
            printf("Attempt to open playback device %d : '%s' ...\n", playbackId, SDL_GetAudioDeviceName(playbackId, SDL_FALSE));
            g_devIdOut = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(playbackId, SDL_FALSE), SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        } else {
            printf("Attempt to open default playback device ...\n");
            g_devIdOut = SDL_OpenAudioDevice(NULL, SDL_FALSE, &playbackSpec, &g_obtainedSpecOut, 0);
        }

        if (!g_devIdOut) {
            printf("Couldn't open an audio device for playback: %s!\n", SDL_GetError());
            g_devIdOut = 0;
        } else {
            printf("Obtained spec for output device (SDL Id = %d):\n", g_devIdOut);
            printf("    - Sample rate:       %d (required: %d)\n", g_obtainedSpecOut.freq, playbackSpec.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecOut.format, playbackSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecOut.channels, playbackSpec.channels);
            printf("    - Samples per frame: %d (required: %d)\n", g_obtainedSpecOut.samples, playbackSpec.samples);

            if (g_obtainedSpecOut.format != playbackSpec.format ||
                g_obtainedSpecOut.channels != playbackSpec.channels ||
                g_obtainedSpecOut.samples != playbackSpec.samples) {
                g_devIdOut = 0;
                SDL_CloseAudio();
                fprintf(stderr, "Failed to initialize playback SDL_OpenAudio!");

                return false;
            }

            reinit = true;
        }
    }

    if (g_devIdInp == 0) {
        SDL_AudioSpec captureSpec;
        captureSpec = g_obtainedSpecOut;
        captureSpec.freq = GGWave::kDefaultSampleRate + sampleRateOffset;
        captureSpec.format = AUDIO_F32SYS;
        captureSpec.samples = 1024;

        SDL_zero(g_obtainedSpecInp);

        if (captureId >= 0) {
            printf("Attempt to open capture device %d : '%s' ...\n", captureId, SDL_GetAudioDeviceName(captureId, SDL_TRUE));
            g_devIdInp = SDL_OpenAudioDevice(SDL_GetAudioDeviceName(captureId, SDL_TRUE), SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        } else {
            printf("Attempt to open default capture device ...\n");
            g_devIdInp = SDL_OpenAudioDevice(g_defaultCaptureDeviceName.empty() ? nullptr : g_defaultCaptureDeviceName.c_str(),
                                            SDL_TRUE, &captureSpec, &g_obtainedSpecInp, 0);
        }
        if (!g_devIdInp) {
            printf("Couldn't open an audio device for capture: %s!\n", SDL_GetError());
            g_devIdInp = 0;
        } else {
            printf("Obtained spec for input device (SDL Id = %d):\n", g_devIdInp);
            printf("    - Sample rate:       %d\n", g_obtainedSpecInp.freq);
            printf("    - Format:            %d (required: %d)\n", g_obtainedSpecInp.format, captureSpec.format);
            printf("    - Channels:          %d (required: %d)\n", g_obtainedSpecInp.channels, captureSpec.channels);
            printf("    - Samples per frame: %d\n", g_obtainedSpecInp.samples);

            reinit = true;
        }
    }

    GGWave::SampleFormat sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
    GGWave::SampleFormat sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;

    switch (g_obtainedSpecInp.format) {
        case AUDIO_U8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatInp = GGWAVE_SAMPLE_FORMAT_F32; break;
    }

    switch (g_obtainedSpecOut.format) {
        case AUDIO_U8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U8;  break;
        case AUDIO_S8:      sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I8;  break;
        case AUDIO_U16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_U16; break;
        case AUDIO_S16SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_I16; break;
        case AUDIO_S32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
        case AUDIO_F32SYS:  sampleFormatOut = GGWAVE_SAMPLE_FORMAT_F32; break;
            break;
    }

    if (reinit) {
        GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_RX_AND_TX;
        if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

        g_ggWave = std::make_shared<GGWave>(GGWave::Parameters {
            payloadLength,
            (float) g_obtainedSpecInp.freq,
            (float) g_obtainedSpecOut.freq,
            GGWave::kDefaultSampleRate,
            GGWave::kDefaultSamplesPerFrame,
            GGWave::kDefaultSoundMarkerThreshold,
            sampleFormatInp,
            sampleFormatOut,
            mode,
        });
    }

    return true;
}